

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

void __thiscall CustomLayer::write_param(CustomLayer *this,FILE *pp)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint id;
  ulong uVar5;
  ParamDict *this_00;
  float fVar6;
  Mat local_c8;
  Mat local_78;
  
  this_00 = &this->mpd;
  id = 0;
  do {
    if (id == 0x20) {
      return;
    }
    iVar3 = ncnn::ParamDict::type(this_00,id);
    switch(iVar3) {
    case 2:
      uVar4 = ncnn::ParamDict::get(this_00,id,0);
      fprintf((FILE *)pp," %d=%d",(ulong)id,(ulong)uVar4);
      break;
    case 3:
      fVar6 = ncnn::ParamDict::get(this_00,id,0.0);
      fprintf((FILE *)pp," %d=%e",SUB84((double)fVar6,0),(ulong)id);
      break;
    case 5:
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      ncnn::ParamDict::get(&local_78,this_00,id,&local_c8);
      piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar4 = local_78.w;
      fprintf((FILE *)pp," %d=%d",(ulong)(-id - 0x5b04),(ulong)(uint)local_78.w);
      pvVar2 = local_78.data;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        fprintf((FILE *)pp,",%d",(ulong)*(uint *)((long)pvVar2 + uVar5 * 4));
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
LAB_0016a1d5:
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      break;
    case 6:
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      ncnn::ParamDict::get(&local_78,this_00,id,&local_c8);
      piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      uVar4 = local_78.w;
      fprintf((FILE *)pp," %d=%d",(ulong)(-id - 0x5b04),(ulong)(uint)local_78.w);
      pvVar2 = local_78.data;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        fprintf((FILE *)pp,",%e",SUB84((double)*(float *)((long)pvVar2 + uVar5 * 4),0));
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) goto LAB_0016a1d5;
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    id = id + 1;
  } while( true );
}

Assistant:

void write_param(FILE* pp)
    {
        for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
        {
            int type = mpd.type(i);
            if (type == 0)
                continue;

            if (type == 2)
            {
                fprintf(pp, " %d=%d", i, mpd.get(i, 0));
            }
            if (type == 3)
            {
                fprintf(pp, " %d=%e", i, mpd.get(i, 0.f));
            }
            if (type == 5)
            {
                ncnn::Mat v = mpd.get(i, ncnn::Mat());
                int len = v.w;
                fprintf(pp, " %d=%d", -i - 23300, len);
                const int* p = v;
                for (int j = 0; j < len; j++)
                {
                    fprintf(pp, ",%d", p[j]);
                }
            }
            if (type == 6)
            {
                ncnn::Mat v = mpd.get(i, ncnn::Mat());
                int len = v.w;
                fprintf(pp, " %d=%d", -i - 23300, len);
                const float* p = v;
                for (int j = 0; j < len; j++)
                {
                    fprintf(pp, ",%e", p[j]);
                }
            }
        }
    }